

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_path.cpp
# Opt level: O2

WorldPath *
WorldPath::from_json
          (Json *json,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
          *nodes,map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 *items)

{
  WorldNode *from_node;
  WorldNode *to_node;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  mapped_type *ppWVar4;
  reference pbVar5;
  WorldPath *this;
  const_iterator __begin2;
  uint16_t local_16c;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> required_nodes;
  vector<Item_*,_std::allocator<Item_*>_> items_placed_when_crossing;
  vector<Item_*,_std::allocator<Item_*>_> required_items;
  Item *local_100;
  const_iterator __end2;
  key_type local_d8;
  string local_b8;
  _Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_> local_98;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_80;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_68;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"fromId",(allocator<char> *)&__begin2);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_d8);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_50,pvVar3);
  std::__cxx11::string::~string((string *)&local_d8);
  ppWVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
            ::at(nodes,&local_50);
  from_node = *ppWVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin2,"toId",(allocator<char> *)&__end2);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&__begin2);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_d8,pvVar3);
  std::__cxx11::string::~string((string *)&__begin2);
  ppWVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
            ::at(nodes,&local_d8);
  to_node = *ppWVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin2,"weight",(allocator<char> *)&local_b8);
  __end2.m_object._0_4_ = 1;
  iVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value<int,_0>(json,(key_type *)&__begin2,(int *)&__end2);
  std::__cxx11::string::~string((string *)&__begin2);
  required_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  required_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  required_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[14],_0>(json,(char (*) [14])"requiredItems");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin2,"requiredItems",(allocator<char> *)&__end2);
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&__begin2);
    std::__cxx11::string::~string((string *)&__begin2);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&__begin2,pvVar3);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&__end2,pvVar3);
    while( true ) {
      bVar1 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&__begin2,&__end2);
      if (!bVar1) break;
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&__begin2);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_b8,pbVar5);
      required_nodes.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)find_item_from_name(items,&local_b8);
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*>
                ((vector<Item*,std::allocator<Item*>> *)&required_items,(Item **)&required_nodes);
      std::__cxx11::string::~string((string *)&local_b8);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++(&__begin2);
    }
  }
  required_nodes.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  required_nodes.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  required_nodes.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[14],_0>(json,(char (*) [14])"requiredNodes");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin2,"requiredNodes",(allocator<char> *)&__end2);
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&__begin2);
    std::__cxx11::string::~string((string *)&__begin2);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&__begin2,pvVar3);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&__end2,pvVar3);
    while( true ) {
      bVar1 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&__begin2,&__end2);
      if (!bVar1) break;
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&__begin2);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_b8,pbVar5);
      ppWVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
                ::at(nodes,&local_b8);
      std::vector<WorldNode*,std::allocator<WorldNode*>>::emplace_back<WorldNode*const&>
                ((vector<WorldNode*,std::allocator<WorldNode*>> *)&required_nodes,ppWVar4);
      std::__cxx11::string::~string((string *)&local_b8);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++(&__begin2);
    }
  }
  items_placed_when_crossing.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  items_placed_when_crossing.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  items_placed_when_crossing.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[24],_0>(json,(char (*) [24])"itemsPlacedWhenCrossing");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin2,"itemsPlacedWhenCrossing",(allocator<char> *)&__end2);
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&__begin2);
    std::__cxx11::string::~string((string *)&__begin2);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&__begin2,pvVar3);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&__end2,pvVar3);
    while( true ) {
      bVar1 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&__begin2,&__end2);
      if (!bVar1) break;
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&__begin2);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_b8,pbVar5);
      local_100 = find_item_from_name(items,&local_b8);
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*>
                ((vector<Item*,std::allocator<Item*>> *)&items_placed_when_crossing,&local_100);
      std::__cxx11::string::~string((string *)&local_b8);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++(&__begin2);
    }
  }
  this = (WorldPath *)operator_new(0x60);
  std::vector<Item_*,_std::allocator<Item_*>_>::vector
            ((vector<Item_*,_std::allocator<Item_*>_> *)&local_80,&required_items);
  std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::vector
            ((vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_98,&required_nodes);
  std::vector<Item_*,_std::allocator<Item_*>_>::vector
            ((vector<Item_*,_std::allocator<Item_*>_> *)&local_68,&items_placed_when_crossing);
  local_16c = (uint16_t)iVar2;
  WorldPath(this,from_node,to_node,local_16c,(vector<Item_*,_std::allocator<Item_*>_> *)&local_80,
            (vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_98,
            (vector<Item_*,_std::allocator<Item_*>_> *)&local_68);
  std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_68);
  std::_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>::~_Vector_base(&local_98);
  std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_80);
  std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
            (&items_placed_when_crossing.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
  std::_Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>::~_Vector_base
            (&required_nodes.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>);
  std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
            (&required_items.super__Vector_base<Item_*,_std::allocator<Item_*>_>);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_50);
  return this;
}

Assistant:

WorldPath* WorldPath::from_json(const Json& json, const std::map<std::string, WorldNode*>& nodes, const std::map<uint8_t, Item*>& items)
{
    const std::string& from_id = json.at("fromId");
    WorldNode* from_node = nodes.at(from_id);

    const std::string& to_id = json.at("toId");
    WorldNode* to_node = nodes.at(to_id);

    uint16_t weight = json.value("weight", 1);

    std::vector<Item*> required_items;
    if(json.contains("requiredItems"))
        for(const std::string& item_name : json.at("requiredItems"))
            required_items.emplace_back(find_item_from_name(items, item_name));

    std::vector<WorldNode*> required_nodes;
    if(json.contains("requiredNodes"))
        for(const std::string& node_id : json.at("requiredNodes"))
            required_nodes.emplace_back(nodes.at(node_id));

    std::vector<Item*> items_placed_when_crossing;
    if(json.contains("itemsPlacedWhenCrossing"))
        for(const std::string& item_name : json.at("itemsPlacedWhenCrossing"))
            items_placed_when_crossing.emplace_back(find_item_from_name(items, item_name));
        
    return new WorldPath(from_node, to_node, weight, required_items, required_nodes, items_placed_when_crossing);
}